

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>::emplaceValue<QList<QCss::StyleRule>>
          (Node<QObject_const*,QList<QCss::StyleRule>> *this,QList<QCss::StyleRule> *args)

{
  qsizetype qVar1;
  Data *pDVar2;
  StyleRule *pSVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::StyleRule> local_48;
  QArrayDataPointer<QCss::StyleRule> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = (args->d).size;
  (args->d).size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (StyleRule *)0x0;
  local_48.size = 0;
  pDVar2 = (args->d).d;
  pSVar3 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (StyleRule *)0x0;
  local_28.d = *(Data **)(this + 8);
  local_28.ptr = *(StyleRule **)(this + 0x10);
  *(Data **)(this + 8) = pDVar2;
  *(StyleRule **)(this + 0x10) = pSVar3;
  local_28.size = *(qsizetype *)(this + 0x18);
  *(qsizetype *)(this + 0x18) = qVar1;
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }